

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_CreateRecordKey_Test::TestBody(Psbt_CreateRecordKey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ByteData key5;
  ByteData key4;
  ByteData key3;
  ByteData key2;
  ByteData key1;
  AssertHelper local_2a0;
  Message local_298;
  string local_290;
  AssertionResult local_270;
  AssertHelper local_260;
  Message local_258;
  string local_250;
  AssertionResult local_230;
  AssertHelper local_220;
  Message local_218;
  string local_210;
  AssertionResult local_1f0;
  AssertHelper local_1e0;
  Message local_1d8;
  string local_1d0;
  AssertionResult local_1b0;
  AssertHelper local_1a0;
  Message local_198;
  string local_190;
  AssertionResult local_170;
  allocator local_159;
  string local_158;
  ByteData local_138;
  allocator local_119;
  string local_118;
  ByteData local_f8;
  ByteData local_e0;
  allocator local_c1;
  string local_c0;
  ByteData local_a0;
  allocator local_71;
  string local_70;
  ByteData local_50;
  ByteData local_38;
  ByteData local_20;
  
  cfd::core::Psbt::CreateRecordKey(&local_20,'\x01');
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"f1f2",&local_71);
  cfd::core::ByteData::ByteData(&local_50,&local_70);
  cfd::core::Psbt::CreateRecordKey(&local_38,'\x02',&local_50);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ae88e);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"abc",&local_c1);
  cfd::core::Psbt::CreateRecordKey(&local_a0,'\x03',&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"d1d2",&local_119);
  cfd::core::ByteData::ByteData(&local_f8,&local_118);
  cfd::core::Psbt::CreateRecordKey(&local_e0,'\x04',&local_f8,'\x05');
  cfd::core::ByteData::~ByteData((ByteData *)0x2ae97d);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"def",&local_159);
  cfd::core::Psbt::CreateRecordKey(&local_138,'\x05',&local_158,'\t');
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_190,&local_20);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_170,"\"01\"","key1.GetHex().c_str()","01",pcVar2);
  std::__cxx11::string::~string((string *)&local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_170);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2aec5a);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x5b3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message((Message *)0x2aecb7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2aed0f);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1d0,&local_38);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1b0,"\"0202f1f2\"","key2.GetHex().c_str()","0202f1f2",pcVar2);
  std::__cxx11::string::~string((string *)&local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2aedf6);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x5b4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message((Message *)0x2aee53);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2aeeab);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_210,&local_a0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1f0,"\"0303616263\"","key3.GetHex().c_str()","0303616263",pcVar2);
  std::__cxx11::string::~string((string *)&local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2aef92);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x5b5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    testing::Message::~Message((Message *)0x2aefef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2af047);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_250,&local_e0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_230,"\"0402d1d205\"","key4.GetHex().c_str()","0402d1d205",pcVar2);
  std::__cxx11::string::~string((string *)&local_250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_230);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2af12e);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x5b6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    testing::Message::~Message((Message *)0x2af18b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2af1e3);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_290,&local_138);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_270,"\"050364656609\"","key5.GetHex().c_str()","050364656609",pcVar2
            );
  std::__cxx11::string::~string((string *)&local_290);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_270);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2af2ca);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x5b7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    testing::Message::~Message((Message *)0x2af31e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2af370);
  cfd::core::ByteData::~ByteData((ByteData *)0x2af37d);
  cfd::core::ByteData::~ByteData((ByteData *)0x2af38a);
  cfd::core::ByteData::~ByteData((ByteData *)0x2af397);
  cfd::core::ByteData::~ByteData((ByteData *)0x2af3a4);
  cfd::core::ByteData::~ByteData((ByteData *)0x2af3b1);
  return;
}

Assistant:

TEST(Psbt, CreateRecordKey) {
  auto key1 = Psbt::CreateRecordKey(1);
  auto key2 = Psbt::CreateRecordKey(2, ByteData("f1f2"));
  auto key3 = Psbt::CreateRecordKey(3, "abc");
  auto key4 = Psbt::CreateRecordKey(4, ByteData("d1d2"), 5);
  auto key5 = Psbt::CreateRecordKey(5, "def", 9);

  EXPECT_STREQ("01", key1.GetHex().c_str());
  EXPECT_STREQ("0202f1f2", key2.GetHex().c_str());
  EXPECT_STREQ("0303616263", key3.GetHex().c_str());
  EXPECT_STREQ("0402d1d205", key4.GetHex().c_str());
  EXPECT_STREQ("050364656609", key5.GetHex().c_str());
}